

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_tests.cpp
# Opt level: O0

void __thiscall mempool_tests::MempoolSizeLimitTest::test_method(MempoolSizeLimitTest *this)

{
  long lVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  CAmount CVar5;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffd408;
  lazy_ostream *in_stack_ffffffffffffd410;
  char *in_stack_ffffffffffffd418;
  CAmount *in_stack_ffffffffffffd420;
  undefined4 in_stack_ffffffffffffd428;
  int in_stack_ffffffffffffd42c;
  const_string *in_stack_ffffffffffffd430;
  CFeeRate in_stack_ffffffffffffd438;
  CTxMemPoolEntry *in_stack_ffffffffffffd440;
  CTxMemPool *in_stack_ffffffffffffd448;
  unit_test_log_t *this_00;
  CTxMemPool *in_stack_ffffffffffffd468;
  CTxMemPool *in_stack_ffffffffffffd470;
  unit_test_log_t *sizelimit;
  undefined7 in_stack_ffffffffffffd478;
  undefined1 in_stack_ffffffffffffd47f;
  undefined8 in_stack_ffffffffffffd490;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffd498;
  CTxMemPool *in_stack_ffffffffffffd4a0;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_ffffffffffffd4d0;
  size_t in_stack_ffffffffffffd4d8;
  CTxMemPool *in_stack_ffffffffffffd4e0;
  MemPoolTest *pool;
  MempoolSizeLimitTest *this_local;
  undefined1 local_2414 [12];
  const_string *local_2408;
  undefined1 local_2400 [16];
  undefined1 local_23f0 [68];
  undefined1 local_23ac [12];
  CAmount local_23a0;
  undefined1 local_2398 [16];
  undefined1 local_2388 [64];
  lazy_ostream local_2348;
  CAmount local_2338;
  undefined1 local_2330 [16];
  undefined1 local_2320 [64];
  lazy_ostream local_22e0;
  CAmount local_22d0;
  undefined1 local_22c8 [16];
  undefined1 local_22b8 [64];
  lazy_ostream local_2278;
  CAmount local_2268;
  undefined1 local_2260 [16];
  undefined1 local_2250 [64];
  lazy_ostream local_2210;
  CAmount local_2200;
  undefined1 local_21f8 [16];
  undefined1 local_21e8 [64];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  vtx;
  const_string local_2190 [2];
  lazy_ostream local_2170 [2];
  assertion_result local_2150 [2];
  const_string local_2118 [2];
  lazy_ostream local_20f8 [2];
  assertion_result local_20d8 [2];
  const_string local_20a0 [2];
  lazy_ostream local_2080 [2];
  assertion_result local_2060 [2];
  const_string local_2028 [2];
  lazy_ostream local_2008 [2];
  assertion_result local_1fe8 [2];
  const_string local_1fb0 [2];
  lazy_ostream local_1f90 [2];
  assertion_result local_1f70 [2];
  const_string local_1f38 [2];
  lazy_ostream local_1f18 [2];
  assertion_result local_1ef8 [2];
  const_string local_1ec0 [2];
  lazy_ostream local_1ea0 [2];
  assertion_result local_1e80 [2];
  CMutableTransaction tx7;
  CMutableTransaction tx6;
  CMutableTransaction tx5;
  CMutableTransaction tx4;
  lazy_ostream local_1d68;
  CAmount local_1d58;
  undefined1 local_1d50 [16];
  undefined1 local_1d40 [64];
  undefined8 local_1d00;
  CFeeRate maxFeeRateRemoved;
  const_string local_1cf0 [2];
  lazy_ostream local_1cd0 [2];
  assertion_result local_1cb0 [2];
  const_string local_1c78 [2];
  lazy_ostream local_1c58 [2];
  assertion_result local_1c38 [2];
  const_string local_1c00 [2];
  lazy_ostream local_1be0 [2];
  assertion_result local_1bc0 [2];
  const_string local_1b88 [2];
  lazy_ostream local_1b68 [2];
  assertion_result local_1b48 [2];
  const_string local_1b10 [2];
  lazy_ostream local_1af0 [2];
  assertion_result local_1ad0 [2];
  const_string local_1a98 [2];
  lazy_ostream local_1a78 [2];
  assertion_result local_1a58 [2];
  CMutableTransaction tx3;
  const_string local_19e8 [2];
  lazy_ostream local_19c8 [2];
  assertion_result local_19a8 [2];
  const_string local_1970 [2];
  lazy_ostream local_1950 [2];
  assertion_result local_1930 [2];
  const_string local_18f8 [2];
  lazy_ostream local_18d8 [2];
  assertion_result local_18b8 [2];
  const_string local_1880 [2];
  lazy_ostream local_1860 [2];
  assertion_result local_1840 [2];
  CMutableTransaction tx2;
  CMutableTransaction tx1;
  TestMemPoolEntryHelper entry;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined8 local_c1c;
  undefined8 uStack_c14;
  undefined8 local_c0c;
  undefined8 uStack_c04;
  uint32_t local_bfc;
  undefined8 local_bac;
  undefined8 uStack_ba4;
  undefined8 local_b9c;
  undefined8 uStack_b94;
  uint32_t local_b8c;
  undefined8 local_adc;
  undefined8 uStack_ad4;
  undefined8 local_acc;
  undefined8 uStack_ac4;
  uint32_t local_abc;
  undefined8 local_a0c;
  undefined8 uStack_a04;
  undefined8 local_9fc;
  undefined8 uStack_9f4;
  uint32_t local_9ec;
  undefined8 local_4e4;
  undefined8 uStack_4dc;
  undefined8 local_4d4;
  undefined8 uStack_4cc;
  uint32_t local_4c4;
  
  local_2008[0].m_empty = false;
  local_2008[0]._9_7_ = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffd448,
             (char *)in_stack_ffffffffffffd440,
             (int)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20),
             (char *)in_stack_ffffffffffffd430,
             (char *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffd418);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd408);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd448,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd440,
             (char *)in_stack_ffffffffffffd438.nSatoshisPerK,(char *)in_stack_ffffffffffffd430,
             in_stack_ffffffffffffd42c,SUB41((uint)in_stack_ffffffffffffd428 >> 0x18,0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd408);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd448,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd440,
             (char *)in_stack_ffffffffffffd438.nSatoshisPerK,(char *)in_stack_ffffffffffffd430,
             in_stack_ffffffffffffd42c,SUB41((uint)in_stack_ffffffffffffd428 >> 0x18,0));
  TestMemPoolEntryHelper::TestMemPoolEntryHelper
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd408);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  pvVar3->nValue = 1000000000;
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd418,(CAmount)in_stack_ffffffffffffd410)
  ;
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd440,
             (CMutableTransaction *)in_stack_ffffffffffffd438.nSatoshisPerK);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffd408);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  pvVar3->nValue = 1000000000;
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd418,(CAmount)in_stack_ffffffffffffd410)
  ;
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd440,
             (CMutableTransaction *)in_stack_ffffffffffffd438.nSatoshisPerK);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffd408);
  CTxMemPool::DynamicMemoryUsage(in_stack_ffffffffffffd468);
  CTxMemPool::TrimToSize
            (in_stack_ffffffffffffd4e0,in_stack_ffffffffffffd4d8,in_stack_ffffffffffffd4d0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1840,local_1860,local_1880,0x1c9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_18b8,local_18d8,local_18f8,0x1ca,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CTxMemPool::DynamicMemoryUsage(in_stack_ffffffffffffd468);
  CTxMemPool::TrimToSize
            (in_stack_ffffffffffffd4e0,in_stack_ffffffffffffd4d8,in_stack_ffffffffffffd4d0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1930,local_1950,local_1970,0x1cd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_19a8,local_19c8,local_19e8,0x1ce,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd440,
             (CMutableTransaction *)in_stack_ffffffffffffd438.nSatoshisPerK);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffd408);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428));
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffd418,(Txid *)in_stack_ffffffffffffd410,
             (uint32_t)((ulong)in_stack_ffffffffffffd408 >> 0x20));
  pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  (pvVar4->prevout).n = local_4c4;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_4d4;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_4cc;
  *(undefined8 *)(pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_4e4;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_4dc;
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  pvVar3->nValue = 1000000000;
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd418,(CAmount)in_stack_ffffffffffffd410)
  ;
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd440,
             (CMutableTransaction *)in_stack_ffffffffffffd438.nSatoshisPerK);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffd408);
  CTxMemPool::DynamicMemoryUsage(in_stack_ffffffffffffd468);
  CTxMemPool::TrimToSize
            (in_stack_ffffffffffffd4e0,in_stack_ffffffffffffd4d8,in_stack_ffffffffffffd4d0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1a58,local_1a78,local_1a98,0x1db,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1ad0,local_1af0,local_1b10,0x1dc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1b48,local_1b68,local_1b88,0x1dd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CTransaction::CTransaction
            ((CTransaction *)in_stack_ffffffffffffd448,
             (CMutableTransaction *)in_stack_ffffffffffffd440);
  GetVirtualTransactionSize((CTransaction *)in_stack_ffffffffffffd408);
  CTxMemPool::TrimToSize
            (in_stack_ffffffffffffd4e0,in_stack_ffffffffffffd4d8,in_stack_ffffffffffffd4d0);
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffd408);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1bc0,local_1be0,local_1c00,0x1e0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c38,local_1c58,local_1c78,0x1e1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1cb0,local_1cd0,local_1cf0,0x1e2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_1d00 = 25000;
  CTransaction::CTransaction
            ((CTransaction *)in_stack_ffffffffffffd448,
             (CMutableTransaction *)in_stack_ffffffffffffd440);
  GetVirtualTransactionSize((CTransaction *)in_stack_ffffffffffffd408);
  CTransaction::CTransaction
            ((CTransaction *)in_stack_ffffffffffffd448,
             (CMutableTransaction *)in_stack_ffffffffffffd440);
  GetVirtualTransactionSize((CTransaction *)in_stack_ffffffffffffd408);
  CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
                     in_stack_ffffffffffffd420,(uint32_t)((ulong)in_stack_ffffffffffffd418 >> 0x20))
  ;
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffd408);
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffd408);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd410,(char (*) [1])in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    local_1d68._8_8_ =
         CTxMemPool::GetMinFee
                   ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffd47f,in_stack_ffffffffffffd478),
                    (size_t)in_stack_ffffffffffffd470);
    local_1d58 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd408);
    CVar5 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd408);
    local_1d68._vptr_lazy_ostream = (_func_int **)(CVar5 + 1000);
    in_stack_ffffffffffffd418 = "maxFeeRateRemoved.GetFeePerK() + 1000";
    in_stack_ffffffffffffd410 = &local_1d68;
    in_stack_ffffffffffffd408 = "pool.GetMinFee(1).GetFeePerK()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1d40,local_1d50,0x1e5,1,2,&local_1d58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  COutPoint::SetNull((COutPoint *)in_stack_ffffffffffffd408);
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  COutPoint::SetNull((COutPoint *)in_stack_ffffffffffffd408);
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  pvVar3->nValue = 1000000000;
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  pvVar3->nValue = 1000000000;
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428));
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffd418,(Txid *)in_stack_ffffffffffffd410,
             (uint32_t)((ulong)in_stack_ffffffffffffd408 >> 0x20));
  pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  (pvVar4->prevout).n = local_9ec;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_9fc;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_9f4;
  *(undefined8 *)(pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_a0c;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_a04;
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  COutPoint::SetNull((COutPoint *)in_stack_ffffffffffffd408);
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  pvVar3->nValue = 1000000000;
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  pvVar3->nValue = 1000000000;
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428));
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffd418,(Txid *)in_stack_ffffffffffffd410,
             (uint32_t)((ulong)in_stack_ffffffffffffd408 >> 0x20));
  pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  (pvVar4->prevout).n = local_abc;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_acc;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_ac4;
  *(undefined8 *)(pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_adc;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_ad4;
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  COutPoint::SetNull((COutPoint *)in_stack_ffffffffffffd408);
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  pvVar3->nValue = 1000000000;
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  pvVar3->nValue = 1000000000;
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428));
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffd418,(Txid *)in_stack_ffffffffffffd410,
             (uint32_t)((ulong)in_stack_ffffffffffffd408 >> 0x20));
  pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  (pvVar4->prevout).n = local_b8c;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_b9c;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_b94;
  *(undefined8 *)(pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_bac;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_ba4;
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428));
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffd418,(Txid *)in_stack_ffffffffffffd410,
             (uint32_t)((ulong)in_stack_ffffffffffffd408 >> 0x20));
  pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  (pvVar4->prevout).n = local_bfc;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_c0c;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_c04;
  *(undefined8 *)(pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_c1c;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_c14;
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428),
             (size_type)in_stack_ffffffffffffd420);
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  pvVar3->nValue = 1000000000;
  CScript::CScript((CScript *)in_stack_ffffffffffffd408);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  CScript::operator<<((CScript *)in_stack_ffffffffffffd440,
                      (opcodetype)((ulong)in_stack_ffffffffffffd438.nSatoshisPerK >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
             (size_type)in_stack_ffffffffffffd410);
  CScript::operator=((CScript *)in_stack_ffffffffffffd418,(CScript *)in_stack_ffffffffffffd410);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd408);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd418,
                      (size_type)in_stack_ffffffffffffd410);
  pvVar3->nValue = 1000000000;
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd418,(CAmount)in_stack_ffffffffffffd410)
  ;
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd440,
             (CMutableTransaction *)in_stack_ffffffffffffd438.nSatoshisPerK);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffd408);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd418,(CAmount)in_stack_ffffffffffffd410)
  ;
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd440,
             (CMutableTransaction *)in_stack_ffffffffffffd438.nSatoshisPerK);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffd408);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd418,(CAmount)in_stack_ffffffffffffd410)
  ;
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd440,
             (CMutableTransaction *)in_stack_ffffffffffffd438.nSatoshisPerK);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffd408);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd418,(CAmount)in_stack_ffffffffffffd410)
  ;
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd440,
             (CMutableTransaction *)in_stack_ffffffffffffd438.nSatoshisPerK);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffd408);
  CTxMemPool::DynamicMemoryUsage(in_stack_ffffffffffffd468);
  CTxMemPool::TrimToSize
            (in_stack_ffffffffffffd4e0,in_stack_ffffffffffffd4d8,in_stack_ffffffffffffd4d0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e80,local_1ea0,local_1ec0,0x21e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1ef8,local_1f18,local_1f38,0x21f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1f70,local_1f90,local_1fb0,0x220,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428));
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
  GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
  bVar2 = CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    TestMemPoolEntryHelper::Fee
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd418,
               (CAmount)in_stack_ffffffffffffd410);
    TestMemPoolEntryHelper::FromTx
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd440,
               (CMutableTransaction *)in_stack_ffffffffffffd438.nSatoshisPerK);
    CTxMemPool::addUnchecked(in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffd408);
  }
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd418,(CAmount)in_stack_ffffffffffffd410)
  ;
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd440,
             (CMutableTransaction *)in_stack_ffffffffffffd438.nSatoshisPerK);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffd408);
  CTxMemPool::DynamicMemoryUsage(in_stack_ffffffffffffd468);
  CTxMemPool::TrimToSize
            (in_stack_ffffffffffffd4e0,in_stack_ffffffffffffd4d8,in_stack_ffffffffffffd4d0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1fe8,local_2008,local_2028,0x227,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2060,local_2080,local_20a0,0x228,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_20d8,local_20f8,local_2118,0x229,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd42c,in_stack_ffffffffffffd428))
    ;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffd408);
    GenTxid::Txid((uint256 *)in_stack_ffffffffffffd408);
    CTxMemPool::exists(in_stack_ffffffffffffd470,(GenTxid *)in_stack_ffffffffffffd468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd418,
               SUB81((ulong)in_stack_ffffffffffffd410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd410,(basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2150,local_2170,local_2190,0x22a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd418,(CAmount)in_stack_ffffffffffffd410)
  ;
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd440,
             (CMutableTransaction *)in_stack_ffffffffffffd438.nSatoshisPerK);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffd408);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd418,(CAmount)in_stack_ffffffffffffd410)
  ;
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffd440,
             (CMutableTransaction *)in_stack_ffffffffffffd438.nSatoshisPerK);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffd408);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_ffffffffffffd408);
  SetMockTime((int64_t)in_stack_ffffffffffffd408);
  SetMockTime((int64_t)in_stack_ffffffffffffd408);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd410,(char (*) [1])in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    local_2210._8_8_ =
         CTxMemPool::GetMinFee
                   ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffd47f,in_stack_ffffffffffffd478),
                    (size_t)in_stack_ffffffffffffd470);
    local_2200 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd408);
    CVar5 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd408);
    local_2210._vptr_lazy_ostream = (_func_int **)(CVar5 + 1000);
    in_stack_ffffffffffffd418 = "maxFeeRateRemoved.GetFeePerK() + 1000";
    in_stack_ffffffffffffd410 = &local_2210;
    in_stack_ffffffffffffd408 = "pool.GetMinFee(1).GetFeePerK()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_21e8,local_21f8,0x232,1,2,&local_2200);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CTxMemPool::removeForBlock
            (in_stack_ffffffffffffd4a0,in_stack_ffffffffffffd498,
             (uint)((ulong)in_stack_ffffffffffffd490 >> 0x20));
  SetMockTime((int64_t)in_stack_ffffffffffffd408);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd410,(char (*) [1])in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    local_2278._8_8_ =
         CTxMemPool::GetMinFee
                   ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffd47f,in_stack_ffffffffffffd478),
                    (size_t)in_stack_ffffffffffffd470);
    local_2268 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd408);
    CVar5 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd408);
    local_2278._vptr_lazy_ostream = (_func_int **)llround((double)(CVar5 + 1000) * 0.5);
    in_stack_ffffffffffffd418 = "llround((maxFeeRateRemoved.GetFeePerK() + 1000)/2.0)";
    in_stack_ffffffffffffd410 = &local_2278;
    in_stack_ffffffffffffd408 = "pool.GetMinFee(1).GetFeePerK()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_2250,local_2260,0x236,1,2,&local_2268);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  SetMockTime((int64_t)in_stack_ffffffffffffd408);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd410,(char (*) [1])in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    CTxMemPool::DynamicMemoryUsage(in_stack_ffffffffffffd468);
    local_22e0._8_8_ =
         CTxMemPool::GetMinFee
                   ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffd47f,in_stack_ffffffffffffd478),
                    (size_t)in_stack_ffffffffffffd470);
    local_22d0 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd408);
    CVar5 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd408);
    local_22e0._vptr_lazy_ostream = (_func_int **)llround((double)(CVar5 + 1000) * 0.25);
    in_stack_ffffffffffffd418 = "llround((maxFeeRateRemoved.GetFeePerK() + 1000)/4.0)";
    in_stack_ffffffffffffd410 = &local_22e0;
    in_stack_ffffffffffffd408 = "pool.GetMinFee(pool.DynamicMemoryUsage() * 5 / 2).GetFeePerK()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_22b8,local_22c8,0x23a,1,2,&local_22d0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  SetMockTime((int64_t)in_stack_ffffffffffffd408);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd410,(char (*) [1])in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    CTxMemPool::DynamicMemoryUsage(in_stack_ffffffffffffd468);
    local_2348._8_8_ =
         CTxMemPool::GetMinFee
                   ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffd47f,in_stack_ffffffffffffd478),
                    (size_t)in_stack_ffffffffffffd470);
    local_2338 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd408);
    CVar5 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd408);
    local_2348._vptr_lazy_ostream = (_func_int **)llround((double)(CVar5 + 1000) * 0.125);
    in_stack_ffffffffffffd418 = "llround((maxFeeRateRemoved.GetFeePerK() + 1000)/8.0)";
    in_stack_ffffffffffffd410 = &local_2348;
    in_stack_ffffffffffffd408 = "pool.GetMinFee(pool.DynamicMemoryUsage() * 9 / 2).GetFeePerK()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_2320,local_2330,0x23e,1,2,&local_2338);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd47f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffd47f);
  SetMockTime((int64_t)in_stack_ffffffffffffd408);
  do {
    sizelimit = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd448,
               (const_string *)in_stack_ffffffffffffd440,in_stack_ffffffffffffd438.nSatoshisPerK,
               in_stack_ffffffffffffd430);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd410,(char (*) [1])in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    local_23ac._4_8_ =
         CTxMemPool::GetMinFee
                   ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffd47f,in_stack_ffffffffffffd478),
                    (size_t)sizelimit);
    local_23a0 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd408);
    local_23ac._0_4_ = 1000;
    in_stack_ffffffffffffd418 = "1000";
    in_stack_ffffffffffffd410 = (lazy_ostream *)local_23ac;
    in_stack_ffffffffffffd408 = "pool.GetMinFee(1).GetFeePerK()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_2388,local_2398,0x242,1,2,&local_23a0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  SetMockTime((int64_t)in_stack_ffffffffffffd408);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)in_stack_ffffffffffffd440,
               in_stack_ffffffffffffd438.nSatoshisPerK,in_stack_ffffffffffffd430);
    in_stack_ffffffffffffd440 = (CTxMemPoolEntry *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd410,(char (*) [1])in_stack_ffffffffffffd408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd418,
               (pointer)in_stack_ffffffffffffd410,(unsigned_long)in_stack_ffffffffffffd408);
    in_stack_ffffffffffffd438 =
         CTxMemPool::GetMinFee
                   ((CTxMemPool *)CONCAT17(in_stack_ffffffffffffd47f,in_stack_ffffffffffffd478),
                    (size_t)sizelimit);
    local_2414._4_8_ = in_stack_ffffffffffffd438;
    in_stack_ffffffffffffd430 =
         (const_string *)CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd408);
    local_2414._0_4_ = 0;
    in_stack_ffffffffffffd418 = "0";
    in_stack_ffffffffffffd410 = (lazy_ostream *)local_2414;
    in_stack_ffffffffffffd408 = "pool.GetMinFee(1).GetFeePerK()";
    local_2408 = in_stack_ffffffffffffd430;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_23f0,local_2400,0x246,1,2,&local_2408);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffd418);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd408);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd408);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd408);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(MempoolSizeLimitTest)
{
    auto& pool = static_cast<MemPoolTest&>(*Assert(m_node.mempool));
    LOCK2(cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    CMutableTransaction tx1 = CMutableTransaction();
    tx1.vin.resize(1);
    tx1.vin[0].scriptSig = CScript() << OP_1;
    tx1.vout.resize(1);
    tx1.vout[0].scriptPubKey = CScript() << OP_1 << OP_EQUAL;
    tx1.vout[0].nValue = 10 * COIN;
    pool.addUnchecked(entry.Fee(10000LL).FromTx(tx1));

    CMutableTransaction tx2 = CMutableTransaction();
    tx2.vin.resize(1);
    tx2.vin[0].scriptSig = CScript() << OP_2;
    tx2.vout.resize(1);
    tx2.vout[0].scriptPubKey = CScript() << OP_2 << OP_EQUAL;
    tx2.vout[0].nValue = 10 * COIN;
    pool.addUnchecked(entry.Fee(5000LL).FromTx(tx2));

    pool.TrimToSize(pool.DynamicMemoryUsage()); // should do nothing
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx1.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx2.GetHash())));

    pool.TrimToSize(pool.DynamicMemoryUsage() * 3 / 4); // should remove the lower-feerate transaction
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx1.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx2.GetHash())));

    pool.addUnchecked(entry.FromTx(tx2));
    CMutableTransaction tx3 = CMutableTransaction();
    tx3.vin.resize(1);
    tx3.vin[0].prevout = COutPoint(tx2.GetHash(), 0);
    tx3.vin[0].scriptSig = CScript() << OP_2;
    tx3.vout.resize(1);
    tx3.vout[0].scriptPubKey = CScript() << OP_3 << OP_EQUAL;
    tx3.vout[0].nValue = 10 * COIN;
    pool.addUnchecked(entry.Fee(20000LL).FromTx(tx3));

    pool.TrimToSize(pool.DynamicMemoryUsage() * 3 / 4); // tx3 should pay for tx2 (CPFP)
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx1.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx2.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx3.GetHash())));

    pool.TrimToSize(GetVirtualTransactionSize(CTransaction(tx1))); // mempool is limited to tx1's size in memory usage, so nothing fits
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx1.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx2.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx3.GetHash())));

    CFeeRate maxFeeRateRemoved(25000, GetVirtualTransactionSize(CTransaction(tx3)) + GetVirtualTransactionSize(CTransaction(tx2)));
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), maxFeeRateRemoved.GetFeePerK() + 1000);

    CMutableTransaction tx4 = CMutableTransaction();
    tx4.vin.resize(2);
    tx4.vin[0].prevout.SetNull();
    tx4.vin[0].scriptSig = CScript() << OP_4;
    tx4.vin[1].prevout.SetNull();
    tx4.vin[1].scriptSig = CScript() << OP_4;
    tx4.vout.resize(2);
    tx4.vout[0].scriptPubKey = CScript() << OP_4 << OP_EQUAL;
    tx4.vout[0].nValue = 10 * COIN;
    tx4.vout[1].scriptPubKey = CScript() << OP_4 << OP_EQUAL;
    tx4.vout[1].nValue = 10 * COIN;

    CMutableTransaction tx5 = CMutableTransaction();
    tx5.vin.resize(2);
    tx5.vin[0].prevout = COutPoint(tx4.GetHash(), 0);
    tx5.vin[0].scriptSig = CScript() << OP_4;
    tx5.vin[1].prevout.SetNull();
    tx5.vin[1].scriptSig = CScript() << OP_5;
    tx5.vout.resize(2);
    tx5.vout[0].scriptPubKey = CScript() << OP_5 << OP_EQUAL;
    tx5.vout[0].nValue = 10 * COIN;
    tx5.vout[1].scriptPubKey = CScript() << OP_5 << OP_EQUAL;
    tx5.vout[1].nValue = 10 * COIN;

    CMutableTransaction tx6 = CMutableTransaction();
    tx6.vin.resize(2);
    tx6.vin[0].prevout = COutPoint(tx4.GetHash(), 1);
    tx6.vin[0].scriptSig = CScript() << OP_4;
    tx6.vin[1].prevout.SetNull();
    tx6.vin[1].scriptSig = CScript() << OP_6;
    tx6.vout.resize(2);
    tx6.vout[0].scriptPubKey = CScript() << OP_6 << OP_EQUAL;
    tx6.vout[0].nValue = 10 * COIN;
    tx6.vout[1].scriptPubKey = CScript() << OP_6 << OP_EQUAL;
    tx6.vout[1].nValue = 10 * COIN;

    CMutableTransaction tx7 = CMutableTransaction();
    tx7.vin.resize(2);
    tx7.vin[0].prevout = COutPoint(tx5.GetHash(), 0);
    tx7.vin[0].scriptSig = CScript() << OP_5;
    tx7.vin[1].prevout = COutPoint(tx6.GetHash(), 0);
    tx7.vin[1].scriptSig = CScript() << OP_6;
    tx7.vout.resize(2);
    tx7.vout[0].scriptPubKey = CScript() << OP_7 << OP_EQUAL;
    tx7.vout[0].nValue = 10 * COIN;
    tx7.vout[1].scriptPubKey = CScript() << OP_7 << OP_EQUAL;
    tx7.vout[1].nValue = 10 * COIN;

    pool.addUnchecked(entry.Fee(7000LL).FromTx(tx4));
    pool.addUnchecked(entry.Fee(1000LL).FromTx(tx5));
    pool.addUnchecked(entry.Fee(1100LL).FromTx(tx6));
    pool.addUnchecked(entry.Fee(9000LL).FromTx(tx7));

    // we only require this to remove, at max, 2 txn, because it's not clear what we're really optimizing for aside from that
    pool.TrimToSize(pool.DynamicMemoryUsage() - 1);
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx4.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx6.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx7.GetHash())));

    if (!pool.exists(GenTxid::Txid(tx5.GetHash())))
        pool.addUnchecked(entry.Fee(1000LL).FromTx(tx5));
    pool.addUnchecked(entry.Fee(9000LL).FromTx(tx7));

    pool.TrimToSize(pool.DynamicMemoryUsage() / 2); // should maximize mempool size by only removing 5/7
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx4.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx5.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx6.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx7.GetHash())));

    pool.addUnchecked(entry.Fee(1000LL).FromTx(tx5));
    pool.addUnchecked(entry.Fee(9000LL).FromTx(tx7));

    std::vector<CTransactionRef> vtx;
    SetMockTime(42);
    SetMockTime(42 + CTxMemPool::ROLLING_FEE_HALFLIFE);
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), maxFeeRateRemoved.GetFeePerK() + 1000);
    // ... we should keep the same min fee until we get a block
    pool.removeForBlock(vtx, 1);
    SetMockTime(42 + 2*CTxMemPool::ROLLING_FEE_HALFLIFE);
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), llround((maxFeeRateRemoved.GetFeePerK() + 1000)/2.0));
    // ... then feerate should drop 1/2 each halflife

    SetMockTime(42 + 2*CTxMemPool::ROLLING_FEE_HALFLIFE + CTxMemPool::ROLLING_FEE_HALFLIFE/2);
    BOOST_CHECK_EQUAL(pool.GetMinFee(pool.DynamicMemoryUsage() * 5 / 2).GetFeePerK(), llround((maxFeeRateRemoved.GetFeePerK() + 1000)/4.0));
    // ... with a 1/2 halflife when mempool is < 1/2 its target size

    SetMockTime(42 + 2*CTxMemPool::ROLLING_FEE_HALFLIFE + CTxMemPool::ROLLING_FEE_HALFLIFE/2 + CTxMemPool::ROLLING_FEE_HALFLIFE/4);
    BOOST_CHECK_EQUAL(pool.GetMinFee(pool.DynamicMemoryUsage() * 9 / 2).GetFeePerK(), llround((maxFeeRateRemoved.GetFeePerK() + 1000)/8.0));
    // ... with a 1/4 halflife when mempool is < 1/4 its target size

    SetMockTime(42 + 7*CTxMemPool::ROLLING_FEE_HALFLIFE + CTxMemPool::ROLLING_FEE_HALFLIFE/2 + CTxMemPool::ROLLING_FEE_HALFLIFE/4);
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), 1000);
    // ... but feerate should never drop below 1000

    SetMockTime(42 + 8*CTxMemPool::ROLLING_FEE_HALFLIFE + CTxMemPool::ROLLING_FEE_HALFLIFE/2 + CTxMemPool::ROLLING_FEE_HALFLIFE/4);
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), 0);
    // ... unless it has gone all the way to 0 (after getting past 1000/2)
}